

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandZeroPo(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint iOutput;
  Abc_Ntk_t *pNtk;
  char *pcVar2;
  uint fUseConst1;
  int iVar3;
  char *pcVar4;
  uint fSkipSweep;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  fSkipSweep = 0;
  Extra_UtilGetoptReset();
  iOutput = 0xffffffff;
  fUseConst1 = 0;
  while( true ) {
    while( true ) {
      while (iVar1 = Extra_UtilGetopt(argc,argv,"Nsoh"), iVar3 = globalUtilOptind, iVar1 == 0x6f) {
        fUseConst1 = fUseConst1 ^ 1;
      }
      if (iVar1 == -1) {
        if (pNtk == (Abc_Ntk_t *)0x0) {
          pcVar2 = "Empty network.\n";
        }
        else if (pNtk->ntkType == ABC_NTK_STRASH) {
          if ((int)iOutput < 0) {
            pcVar2 = "The output index is not specified.\n";
          }
          else {
            if ((int)iOutput < pNtk->vPos->nSize) {
              Abc_NtkDropOneOutput(pNtk,iOutput,fSkipSweep,fUseConst1);
              return 0;
            }
            pcVar2 = "The output index is larger than the allowed POs.\n";
          }
        }
        else {
          pcVar2 = "The network is not strashed.\n";
        }
        iVar3 = -1;
        goto LAB_00228a8a;
      }
      if (iVar1 != 0x73) break;
      fSkipSweep = fSkipSweep ^ 1;
    }
    if (iVar1 != 0x4e) goto LAB_00228a0a;
    if (argc <= globalUtilOptind) break;
    iOutput = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar3 + 1;
    if ((int)iOutput < 0) {
LAB_00228a0a:
      iVar3 = -2;
      Abc_Print(-2,"usage: zeropo [-N <num>] [-soh]\n");
      Abc_Print(-2,"\t           replaces the PO driver by constant 0\n");
      Abc_Print(-2,"\t-N <num> : the zero-based index of the PO to replace [default = %d]\n",
                (ulong)iOutput);
      pcVar4 = "yes";
      pcVar2 = "no";
      if (fSkipSweep == 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-s       : performs comb sweep after removimg a PO [default = %s]\n",pcVar2);
      if (fUseConst1 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-o       : toggles using const 1 instead of const 0 [default = %s]\n",pcVar4);
      pcVar2 = "\t-h       : print the command usage\n";
LAB_00228a8a:
      Abc_Print(iVar3,pcVar2);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
  goto LAB_00228a0a;
}

Assistant:

int Abc_CommandZeroPo( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);//, * pNtkRes = NULL;
    int c, iOutput = -1;
    int fSkipSweep = 0;
    int fUseConst1 = 0;
    extern void Abc_NtkDropOneOutput( Abc_Ntk_t * pNtk, int iOutput, int fSkipSweep, int fUseConst1 );

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Nsoh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            iOutput = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iOutput < 0 )
                goto usage;
            break;
        case 's':
            fSkipSweep ^= 1;
            break;
        case 'o':
            fUseConst1 ^= 1;
            break;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "The network is not strashed.\n" );
        return 1;
    }
    if ( iOutput < 0 )
    {
        Abc_Print( -1, "The output index is not specified.\n" );
        return 1;
    }
    if ( iOutput >= Abc_NtkPoNum(pNtk) )
    {
        Abc_Print( -1, "The output index is larger than the allowed POs.\n" );
        return 1;
    }

    // get the new network
//    pNtkRes = Abc_NtkDup( pNtk );
//    Abc_NtkDropOneOutput( pNtkRes, iOutput );
//    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    Abc_NtkDropOneOutput( pNtk, iOutput, fSkipSweep, fUseConst1 );
    return 0;

usage:
    Abc_Print( -2, "usage: zeropo [-N <num>] [-soh]\n" );
    Abc_Print( -2, "\t           replaces the PO driver by constant 0\n" );
    Abc_Print( -2, "\t-N <num> : the zero-based index of the PO to replace [default = %d]\n", iOutput );
    Abc_Print( -2, "\t-s       : performs comb sweep after removimg a PO [default = %s]\n", !fSkipSweep? "yes": "no" );
    Abc_Print( -2, "\t-o       : toggles using const 1 instead of const 0 [default = %s]\n", fUseConst1? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}